

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int detectsuffix(char *str,char *suffix)

{
  __int32_t *p_Var1;
  uint uVar2;
  __int32_t **pp_Var3;
  ushort **ppuVar4;
  long lVar5;
  char cVar6;
  char *pcVar7;
  
  pp_Var3 = __ctype_toupper_loc();
  p_Var1 = *pp_Var3;
  lVar5 = (long)*str;
  cVar6 = *suffix;
  if (p_Var1[lVar5] == p_Var1[cVar6]) {
    pcVar7 = suffix + 1;
    do {
      if ((char)lVar5 == '\0') {
        return 1;
      }
      lVar5 = (long)str[1];
      str = str + 1;
      cVar6 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (p_Var1[lVar5] == p_Var1[cVar6]);
  }
  uVar2 = 0;
  if (cVar6 == '\0') {
    ppuVar4 = __ctype_b_loc();
    do {
      cVar6 = *str;
      str = str + 1;
    } while ((*(byte *)((long)*ppuVar4 + (long)cVar6 * 2 + 1) & 0x20) != 0);
    uVar2 = (uint)(cVar6 == '\0');
  }
  return uVar2;
}

Assistant:

static int detectsuffix(const char * str, const char * suffix) {
	/* scan pairwise through strings until mismatch detected */
	while ( toupper(*str) == toupper(*suffix) ) {
		/* printf("'%c' '%c'\n", *str, *suffix); */

		/* return 1 (success) if match persists until the string terminator */
		if (*str == '\0') {
			return 1;
		}

		/* next chars */
		str++;
		suffix++;
	}

	/* printf("'%c' '%c' mismatch\n", *str, *suffix); */

	/* return 0 (fail) if the matching did not consume the entire suffix */
	if (*suffix != 0) {
		return 0;    /* failed to consume entire suffix */
	}

	/* skip any remaining whitespace in str */
	while (isspace(*str)) {
		str++;
	}

	/* return 1 (success) if we have reached end of str else return 0 (fail) */
	return (*str == '\0') ? 1 : 0;
}